

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.cpp
# Opt level: O0

void __thiscall
CSnapshotStorage::Add
          (CSnapshotStorage *this,int Tick,int64 Tagtime,int DataSize,void *pData,bool CreateAlt)

{
  undefined8 *puVar1;
  int in_ECX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  byte in_R9B;
  CHolder *pHolder;
  int TotalSize;
  void *in_stack_ffffffffffffffb8;
  
  puVar1 = (undefined8 *)mem_alloc(0);
  *(undefined4 *)(puVar1 + 3) = in_ESI;
  puVar1[2] = in_RDX;
  *(int *)((long)puVar1 + 0x1c) = in_ECX;
  puVar1[4] = puVar1 + 6;
  mem_copy(in_RDI,in_stack_ffffffffffffffb8,0);
  if ((in_R9B & 1) == 0) {
    puVar1[5] = 0;
  }
  else {
    puVar1[5] = puVar1[4] + (long)in_ECX;
    mem_copy(in_RDI,in_stack_ffffffffffffffb8,0);
  }
  puVar1[1] = 0;
  *puVar1 = in_RDI[1];
  if (in_RDI[1] == 0) {
    *in_RDI = puVar1;
  }
  else {
    *(undefined8 **)(in_RDI[1] + 8) = puVar1;
  }
  in_RDI[1] = puVar1;
  return;
}

Assistant:

void CSnapshotStorage::Add(int Tick, int64 Tagtime, int DataSize, const void *pData, bool CreateAlt)
{
	// allocate memory for holder + snapshot_data
	int TotalSize = sizeof(CHolder)+DataSize;

	if(CreateAlt)
		TotalSize += DataSize;

	CHolder *pHolder = (CHolder *)mem_alloc(TotalSize);

	// set data
	pHolder->m_Tick = Tick;
	pHolder->m_Tagtime = Tagtime;
	pHolder->m_SnapSize = DataSize;
	pHolder->m_pSnap = (CSnapshot*)(pHolder+1);
	mem_copy(pHolder->m_pSnap, pData, DataSize);

	if(CreateAlt) // create alternative if wanted
	{
		pHolder->m_pAltSnap = (CSnapshot*)(((char *)pHolder->m_pSnap) + DataSize);
		mem_copy(pHolder->m_pAltSnap, pData, DataSize);
	}
	else
		pHolder->m_pAltSnap = 0;


	// link
	pHolder->m_pNext = 0;
	pHolder->m_pPrev = m_pLast;
	if(m_pLast)
		m_pLast->m_pNext = pHolder;
	else
		m_pFirst = pHolder;
	m_pLast = pHolder;
}